

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::recoverboundary(tetgenmesh *this,clock_t *tv)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  arraypool *this_00;
  arraypool *paVar5;
  unsigned_long uVar6;
  clock_t cVar7;
  uint uVar8;
  long bak_inpoly_count;
  long bak_volref_count;
  long bak_facref_count;
  long bak_segref_count;
  int i;
  int s;
  int nit;
  long ms;
  point *parypt;
  point rempt;
  face *paryseg;
  face searchseg;
  face *parysh;
  face searchsh;
  arraypool *bdrysteinerptlist;
  arraypool *misshlist;
  arraypool *misseglist;
  clock_t *tv_local;
  tetgenmesh *this_local;
  
  face::face((face *)&parysh);
  face::face((face *)&paryseg);
  if (this->b->quiet == 0) {
    printf("Recovering boundaries...\n");
  }
  if (this->b->verbose != 0) {
    printf("  Recovering segments.\n");
  }
  this->checksubsegflag = 1;
  this_00 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_00,0x10,8);
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,8,8);
  searchsh._8_8_ = paVar5;
  memorypool::traversalinit(this->subsegs);
  for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this->subsegs->items;
      bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
    uVar6 = randomnation(this,bak_segref_count._4_4_ + 1);
    uVar8 = (uint)uVar6;
    arraypool::newindex(this->subsegstack,&rempt);
    face::operator=((face *)rempt,
                    (face *)(this->subsegstack->toparray
                             [(int)uVar8 >> ((byte)this->subsegstack->log2objectsperblock & 0x1f)] +
                            (int)((uVar8 & this->subsegstack->objectsperblockmark) *
                                 this->subsegstack->objectbytes)));
    paryseg = (face *)shellfacetraverse(this,this->subsegs);
    rempt = (point)(this->subsegstack->toparray
                    [(int)uVar8 >> ((byte)this->subsegstack->log2objectsperblock & 0x1f)] +
                   (int)((uVar8 & this->subsegstack->objectsperblockmark) *
                        this->subsegstack->objectbytes));
    face::operator=((face *)rempt,(face *)&paryseg);
  }
  _s = this->subsegs->items;
  i = 0;
  if (this->b->fliplinklevel < 0) {
    this->autofliplinklevel = 1;
  }
  while ((recoversegments(this,this_00,0,0), 0 < this_00->objects && (this->b->fliplinklevel < 0)))
  {
    if (this_00->objects < _s) {
      _s = this_00->objects;
      if (0 < i) {
        i = i + -1;
      }
    }
    else {
      i = i + 1;
      if (2 < i) {
        this->b->fliplinklevel = 100000;
      }
    }
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this_00->objects;
        bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      arraypool::newindex(this->subsegstack,&rempt);
      face::operator=((face *)rempt,
                      (face *)(this_00->toparray
                               [(int)bak_segref_count._4_4_ >>
                                ((byte)this_00->log2objectsperblock & 0x1f)] +
                              (int)((bak_segref_count._4_4_ & this_00->objectsperblockmark) *
                                   this_00->objectbytes)));
    }
    arraypool::restart(this_00);
    this->autofliplinklevel = this->b->fliplinklevelinc + this->autofliplinklevel;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - this_00->objects
           ,this_00->objects);
  }
  if (0 < this_00->objects) {
    do {
      if (this_00->objects < 1) break;
      lVar1 = this_00->objects;
      for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this_00->objects;
          bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
        arraypool::newindex(this->subsegstack,&rempt);
        face::operator=((face *)rempt,
                        (face *)(this_00->toparray
                                 [(int)bak_segref_count._4_4_ >>
                                  ((byte)this_00->log2objectsperblock & 0x1f)] +
                                (int)((bak_segref_count._4_4_ & this_00->objectsperblockmark) *
                                     this_00->objectbytes)));
      }
      arraypool::restart(this_00);
      recoversegments(this,this_00,1,0);
    } while (this_00->objects < lVar1);
    if (this->b->verbose != 0) {
      printf("  %ld (%ld) segments are recovered (missing).\n",
             this->subsegs->items - this_00->objects,this_00->objects);
    }
  }
  if (0 < this_00->objects) {
    do {
      if (this_00->objects < 1) break;
      lVar1 = this_00->objects;
      for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this_00->objects;
          bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
        arraypool::newindex(this->subsegstack,&rempt);
        face::operator=((face *)rempt,
                        (face *)(this_00->toparray
                                 [(int)bak_segref_count._4_4_ >>
                                  ((byte)this_00->log2objectsperblock & 0x1f)] +
                                (int)((bak_segref_count._4_4_ & this_00->objectsperblockmark) *
                                     this_00->objectbytes)));
      }
      arraypool::restart(this_00);
      recoversegments(this,this_00,1,1);
    } while (this_00->objects < lVar1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in volume.\n",this->st_volref_count);
    }
  }
  if (0 < this_00->objects) {
    lVar1 = this->st_volref_count;
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this_00->objects;
        bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      arraypool::newindex(this->subsegstack,&rempt);
      face::operator=((face *)rempt,
                      (face *)(this_00->toparray
                               [(int)bak_segref_count._4_4_ >>
                                ((byte)this_00->log2objectsperblock & 0x1f)] +
                              (int)((bak_segref_count._4_4_ & this_00->objectsperblockmark) *
                                   this_00->objectbytes)));
    }
    arraypool::restart(this_00);
    recoversegments(this,this_00,1,2);
    if ((this->b->verbose != 0) &&
       (printf("  Added %ld Steiner points in segments.\n",this->st_segref_count),
       lVar1 < this->st_volref_count)) {
      printf("  Added another %ld Steiner points in volume.\n",this->st_volref_count - lVar1);
    }
  }
  if (0 < this->st_segref_count) {
    lVar1 = this->st_segref_count;
    lVar2 = this->st_volref_count;
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this->subvertstack->objects
        ; bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      ms = (long)(this->subvertstack->toparray
                  [(int)bak_segref_count._4_4_ >>
                   ((byte)this->subvertstack->log2objectsperblock & 0x1f)] +
                 (int)((bak_segref_count._4_4_ & this->subvertstack->objectsperblockmark) *
                      this->subvertstack->objectbytes));
      parypt = *(point **)ms;
      iVar4 = removevertexbyflips(this,(point)parypt);
      if (iVar4 == 0) {
        arraypool::newindex((arraypool *)searchsh._8_8_,(void **)&ms);
        *(point **)ms = parypt;
      }
    }
    if ((this->b->verbose != 0) && (this->st_segref_count < lVar1)) {
      if (lVar2 < this->st_volref_count) {
        printf("  Suppressed %ld Steiner points in segments.\n",this->st_volref_count - lVar2);
      }
      if (this->st_segref_count + (this->st_volref_count - lVar2) < lVar1) {
        printf("  Removed %ld Steiner points in segments.\n",
               lVar1 - (this->st_segref_count + (this->st_volref_count - lVar2)));
      }
    }
    arraypool::restart(this->subvertstack);
  }
  cVar7 = clock();
  *tv = cVar7;
  if (this->b->verbose != 0) {
    printf("  Recovering facets.\n");
  }
  this->checksubfaceflag = 1;
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,0x10,8);
  memorypool::traversalinit(this->subfaces);
  for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this->subfaces->items;
      bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
    uVar6 = randomnation(this,bak_segref_count._4_4_ + 1);
    uVar8 = (uint)uVar6;
    arraypool::newindex(this->subfacstack,(void **)&searchseg.shver);
    face::operator=((face *)searchseg._8_8_,
                    (face *)(this->subfacstack->toparray
                             [(int)uVar8 >> ((byte)this->subfacstack->log2objectsperblock & 0x1f)] +
                            (int)((uVar8 & this->subfacstack->objectsperblockmark) *
                                 this->subfacstack->objectbytes)));
    parysh = (face *)shellfacetraverse(this,this->subfaces);
    searchseg._8_8_ =
         this->subfacstack->toparray
         [(int)uVar8 >> ((byte)this->subfacstack->log2objectsperblock & 0x1f)] +
         (int)((uVar8 & this->subfacstack->objectsperblockmark) * this->subfacstack->objectbytes);
    face::operator=((face *)searchseg._8_8_,(face *)&parysh);
  }
  _s = this->subfaces->items;
  i = 0;
  this->b->fliplinklevel = -1;
  if (this->b->fliplinklevel < 0) {
    this->autofliplinklevel = 1;
  }
  while ((recoversubfaces(this,paVar5,0), 0 < paVar5->objects && (this->b->fliplinklevel < 0))) {
    if (paVar5->objects < _s) {
      _s = paVar5->objects;
      if (0 < i) {
        i = i + -1;
      }
    }
    else {
      i = i + 1;
      if (2 < i) {
        this->b->fliplinklevel = 100000;
      }
    }
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < paVar5->objects;
        bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      arraypool::newindex(this->subfacstack,(void **)&searchseg.shver);
      face::operator=((face *)searchseg._8_8_,
                      (face *)(paVar5->toparray
                               [(int)bak_segref_count._4_4_ >>
                                ((byte)paVar5->log2objectsperblock & 0x1f)] +
                              (int)((bak_segref_count._4_4_ & paVar5->objectsperblockmark) *
                                   paVar5->objectbytes)));
    }
    arraypool::restart(paVar5);
    this->autofliplinklevel = this->b->fliplinklevelinc + this->autofliplinklevel;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n",this->subfaces->items - paVar5->objects
           ,paVar5->objects);
  }
  if (0 < paVar5->objects) {
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < paVar5->objects;
        bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      arraypool::newindex(this->subfacstack,(void **)&searchseg.shver);
      face::operator=((face *)searchseg._8_8_,
                      (face *)(paVar5->toparray
                               [(int)bak_segref_count._4_4_ >>
                                ((byte)paVar5->log2objectsperblock & 0x1f)] +
                              (int)((bak_segref_count._4_4_ & paVar5->objectsperblockmark) *
                                   paVar5->objectbytes)));
    }
    arraypool::restart(paVar5);
    recoversubfaces(this,(arraypool *)0x0,1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in facets.\n",this->st_facref_count);
    }
  }
  if (0 < this->st_facref_count) {
    lVar1 = this->st_facref_count;
    for (bak_segref_count._4_4_ = 0; (long)(int)bak_segref_count._4_4_ < this->subvertstack->objects
        ; bak_segref_count._4_4_ = bak_segref_count._4_4_ + 1) {
      ms = (long)(this->subvertstack->toparray
                  [(int)bak_segref_count._4_4_ >>
                   ((byte)this->subvertstack->log2objectsperblock & 0x1f)] +
                 (int)((bak_segref_count._4_4_ & this->subvertstack->objectsperblockmark) *
                      this->subvertstack->objectbytes));
      parypt = *(point **)ms;
      iVar4 = removevertexbyflips(this,*(point *)ms);
      if (iVar4 == 0) {
        arraypool::newindex((arraypool *)searchsh._8_8_,(void **)&ms);
        *(point **)ms = parypt;
      }
    }
    if ((this->b->verbose != 0) && (this->st_facref_count < lVar1)) {
      printf("  Removed %ld Steiner points in facets.\n",lVar1 - this->st_facref_count);
    }
    arraypool::restart(this->subvertstack);
  }
  if ((0 < *(long *)(searchsh._8_8_ + 0x20)) && (this->b->verbose != 0)) {
    printf("  %ld Steiner points remained in boundary.\n",*(undefined8 *)(searchsh._8_8_ + 0x20));
  }
  uVar3 = searchsh._8_8_;
  this->totalworkmemory =
       this_00->totalmemory + paVar5->totalmemory + *(long *)(searchsh._8_8_ + 0x28) +
       this->totalworkmemory;
  if (searchsh._8_8_ != 0) {
    arraypool::~arraypool((arraypool *)searchsh._8_8_);
    operator_delete((void *)uVar3,0x30);
  }
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  if (paVar5 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar5);
    operator_delete(paVar5,0x30);
  }
  return;
}

Assistant:

void tetgenmesh::recoverboundary(clock_t& tv)
{
  arraypool *misseglist, *misshlist;
  arraypool *bdrysteinerptlist;
  face searchsh, *parysh;
  face searchseg, *paryseg;
  point rempt, *parypt;
  long ms; // The number of missing segments/subfaces.
  int nit; // The number of iterations.
  int s, i;

  // Counters.
  long bak_segref_count, bak_facref_count, bak_volref_count;

  if (!b->quiet) {
    printf("Recovering boundaries...\n");
  }


  if (b->verbose) {
    printf("  Recovering segments.\n");
  }

  // Segments will be introduced.
  checksubsegflag = 1;

  misseglist = new arraypool(sizeof(face), 8);
  bdrysteinerptlist = new arraypool(sizeof(point), 8);

  // In random order.
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // The init number of missing segments.
  ms = subsegs->items;
  nit = 0; 
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  // First, trying to recover segments by only doing flips.
  while (1) {
    recoversegments(misseglist, 0, 0);

    if (misseglist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misseglist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misseglist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misseglist->objects; i++) {
          subsegstack->newindex((void **) &paryseg);
          *paryseg = * (face *) fastlookup(misseglist, i);
        }
        misseglist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All segments are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) segments are recovered (missing).\n", 
           subsegs->items - misseglist->objects, misseglist->objects);
  }

  if (misseglist->objects > 0) {
    // Second, trying to recover segments by doing more flips (fullsearch).
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 0);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  %ld (%ld) segments are recovered (missing).\n", 
             subsegs->items - misseglist->objects, misseglist->objects);
    }
  }

  if (misseglist->objects > 0) {
    // Third, trying to recover segments by doing more flips (fullsearch)
    //   and adding Steiner points in the volume.
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 1);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  Added %ld Steiner points in volume.\n", st_volref_count);
    }
  }

  if (misseglist->objects > 0) {
    // Last, trying to recover segments by doing more flips (fullsearch),
    //   and adding Steiner points in the volume, and splitting segments.
    long bak_inpoly_count = st_volref_count; //st_inpoly_count;
    for (i = 0; i < misseglist->objects; i++) {
      subsegstack->newindex((void **) &paryseg);
      *paryseg = * (face *) fastlookup(misseglist, i);
    }
    misseglist->restart();

    recoversegments(misseglist, 1, 2);

    if (b->verbose) {
      printf("  Added %ld Steiner points in segments.\n", st_segref_count);
      if (st_volref_count > bak_inpoly_count) {
        printf("  Added another %ld Steiner points in volume.\n", 
               st_volref_count - bak_inpoly_count);
      }
    }
  }


  if (st_segref_count > 0) {
    // Try to remove the Steiner points added in segments.
    bak_segref_count = st_segref_count;
    bak_volref_count = st_volref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(rempt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_segref_count < bak_segref_count) {
        if (bak_volref_count < st_volref_count) {
          printf("  Suppressed %ld Steiner points in segments.\n", 
                 st_volref_count - bak_volref_count);
        }
        if ((st_segref_count + (st_volref_count - bak_volref_count)) <
            bak_segref_count) {
          printf("  Removed %ld Steiner points in segments.\n", 
                 bak_segref_count - 
                   (st_segref_count + (st_volref_count - bak_volref_count)));
        }
      }
    }
    subvertstack->restart();
  }


  tv = clock();

  if (b->verbose) {
    printf("  Recovering facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  misshlist = new arraypool(sizeof(face), 8);

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  ms = subfaces->items;
  nit = 0; 
  b->fliplinklevel = -1; // Init.
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  while (1) {
    recoversubfaces(misshlist, 0);

    if (misshlist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misshlist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misshlist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misshlist->objects; i++) {
          subfacstack->newindex((void **) &parysh);
          *parysh = * (face *) fastlookup(misshlist, i);
        }
        misshlist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All subfaces are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n", 
           subfaces->items - misshlist->objects, misshlist->objects);
  }

  if (misshlist->objects > 0) {
    // There are missing subfaces. Add Steiner points.
    for (i = 0; i < misshlist->objects; i++) {
      subfacstack->newindex((void **) &parysh);
      *parysh = * (face *) fastlookup(misshlist, i);
    }
    misshlist->restart();

    recoversubfaces(NULL, 1);

    if (b->verbose) {
      printf("  Added %ld Steiner points in facets.\n", st_facref_count);
    }
  }


  if (st_facref_count > 0) {
    // Try to remove the Steiner points added in facets.
    bak_facref_count = st_facref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(*parypt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_facref_count < bak_facref_count) {
        printf("  Removed %ld Steiner points in facets.\n", 
               bak_facref_count - st_facref_count);
      }
    }
    subvertstack->restart();
  }


  if (bdrysteinerptlist->objects > 0) {
    if (b->verbose) {
      printf("  %ld Steiner points remained in boundary.\n",
             bdrysteinerptlist->objects);
    }
  } // if


  // Accumulate the dynamic memory.
  totalworkmemory += (misseglist->totalmemory + misshlist->totalmemory +
                      bdrysteinerptlist->totalmemory);

  delete bdrysteinerptlist;
  delete misseglist;
  delete misshlist;
}